

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_list(lyout *out,int level,lyd_node *node,int is_list,int toplevel,int options)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  uint local_7c;
  int local_6c;
  uint local_5c;
  uint local_4c;
  char *ns;
  lyd_node *child;
  int options_local;
  int toplevel_local;
  int is_list_local;
  lyd_node *node_local;
  int level_local;
  lyout *out_local;
  
  if (is_list != 0) {
    if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
       (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
      if (level == 0) {
        local_5c = 0;
      }
      else {
        local_5c = level * 2 - 2;
      }
      ly_print(out,"%*s<%s",(ulong)local_5c,"",node->schema->name);
    }
    else {
      plVar2 = lyd_node_module(node);
      if (level == 0) {
        local_4c = 0;
      }
      else {
        local_4c = level * 2 - 2;
      }
      ly_print(out,"%*s<%s xmlns=\"%s\"",(ulong)local_4c,"",node->schema->name,plVar2->ns);
    }
    if (toplevel != 0) {
      xml_print_ns(out,node,options);
    }
    xml_print_attrs(out,node,options);
    if (node->child == (lyd_node *)0x0) {
      pcVar3 = "";
      if (level != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,"/>%s",pcVar3);
    }
    else {
      pcVar3 = "";
      if (level != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,">%s",pcVar3);
      for (ns = (char *)node->child; ns != (char *)0x0; ns = *(char **)(ns + 0x18)) {
        if (level == 0) {
          local_6c = 0;
        }
        else {
          local_6c = level + 1;
        }
        xml_print_node(out,local_6c,(lyd_node *)ns,0,options);
      }
      if (level == 0) {
        local_7c = 0;
      }
      else {
        local_7c = level * 2 - 2;
      }
      pcVar3 = "";
      if (level != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,"%*s</%s>%s",(ulong)local_7c,"",node->schema->name,pcVar3);
    }
    return;
  }
  xml_print_leaf(out,level,node,toplevel,options);
  return;
}

Assistant:

static void
xml_print_list(struct lyout *out, int level, const struct lyd_node *node, int is_list, int toplevel, int options)
{
    struct lyd_node *child;
    const char *ns;

    if (is_list) {
        /* list print */
        if (toplevel || !node->parent || nscmp(node, node->parent)) {
            /* print "namespace" */
            ns = lyd_node_module(node)->ns;
            ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
        } else {
            ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
        }

        if (toplevel) {
            xml_print_ns(out, node, options);
        }
        xml_print_attrs(out, node, options);

        if (!node->child) {
            ly_print(out, "/>%s", level ? "\n" : "");
            return;
        }
        ly_print(out, ">%s", level ? "\n" : "");

        LY_TREE_FOR(node->child, child) {
            xml_print_node(out, level ? level + 1 : 0, child, 0, options);
        }

        ly_print(out, "%*s</%s>%s", LEVEL, INDENT, node->schema->name, level ? "\n" : "");
    } else {
        /* leaf-list print */
        xml_print_leaf(out, level, node, toplevel, options);
    }
}